

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

Result<CBlockIndex_*> * __thiscall
ChainstateManager::ActivateSnapshot
          (ChainstateManager *this,AutoFile *coins_file,SnapshotMetadata *metadata,bool in_memory)

{
  string_view source_file;
  string_view source_file_00;
  string_view logging_function;
  string_view logging_function_00;
  bool bVar1;
  undefined1 uVar2;
  CBlockIndex *pCVar3;
  CBlockIndex *pCVar4;
  CTxMemPool *pCVar5;
  unsigned_long uVar6;
  Chainstate *pCVar7;
  pointer pCVar8;
  ulong uVar9;
  type this_00;
  type snapshot_chainstate_00;
  pointer pCVar10;
  size_t sVar11;
  long in_RCX;
  long in_RSI;
  Result<CBlockIndex_*> *in_RDI;
  ChainstateManager *this_01;
  byte in_R8B;
  long in_FS_OFFSET;
  double dVar12;
  bool chaintip_loaded;
  int64_t current_coinstip_cache_size;
  int64_t current_coinsdb_cache_size;
  CTxMemPool *mempool;
  bool start_block_invalid;
  CBlockIndex *snapshot_start_block;
  anon_class_16_2_a94f38f8 cleanup_bad_snapshot;
  __single_object snapshot_chainstate;
  vector<int,_std::allocator<int>_> available_heights;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock48;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock47;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock46;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock44;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock43;
  Result<void> res;
  string heights_formatted;
  uint256 base_blockhash;
  undefined4 in_stack_fffffffffffff5c8;
  undefined4 uVar13;
  undefined4 in_stack_fffffffffffff5cc;
  CBlockIndex *in_stack_fffffffffffff5d0;
  ChainstateManager *in_stack_fffffffffffff5d8;
  CCoinsViewCache *this_02;
  ChainstateManager *in_stack_fffffffffffff5e0;
  undefined4 in_stack_fffffffffffff5e8;
  int in_stack_fffffffffffff5ec;
  char *in_stack_fffffffffffff5f0;
  anon_class_16_2_c907b028 *in_stack_fffffffffffff5f8;
  int line;
  string *in_stack_fffffffffffff600;
  allocator<char> *in_stack_fffffffffffff608;
  CChainParams *in_stack_fffffffffffff610;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff618;
  bilingual_str *in_stack_fffffffffffff620;
  undefined7 in_stack_fffffffffffff628;
  undefined1 in_stack_fffffffffffff62f;
  LogFlags in_stack_fffffffffffff630;
  undefined4 in_stack_fffffffffffff638;
  int in_stack_fffffffffffff63c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff640;
  Chainstate *in_stack_fffffffffffff648;
  ConstevalFormatString<1U> in_stack_fffffffffffff678;
  undefined7 in_stack_fffffffffffff698;
  byte bVar14;
  Level in_stack_fffffffffffff770;
  char *this_03;
  undefined7 in_stack_fffffffffffff780;
  undefined1 local_810 [48];
  SnapshotMetadata *in_stack_fffffffffffff820;
  AutoFile *in_stack_fffffffffffff828;
  Chainstate *in_stack_fffffffffffff830;
  undefined2 in_stack_fffffffffffff838;
  undefined1 in_stack_fffffffffffff83a;
  undefined1 in_stack_fffffffffffff83b;
  undefined4 in_stack_fffffffffffff83c;
  allocator<char> local_794;
  allocator<char> local_793;
  allocator<char> local_792;
  allocator<char> local_791;
  undefined1 local_790 [31];
  allocator<char> local_771;
  _Optional_payload_base<int> local_770;
  CCoinsViewCache local_718 [3];
  undefined1 local_128 [256];
  size_t local_28;
  size_t local_20;
  undefined8 local_18;
  undefined8 local_10;
  undefined8 local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_28 = *(size_t *)(in_RCX + 0x34);
  local_20 = *(size_t *)(in_RCX + 0x3c);
  local_18 = *(long *)(in_RCX + 0x44);
  local_10 = *(undefined8 *)(in_RCX + 0x4c);
  SnapshotBlockhash((ChainstateManager *)
                    CONCAT44(in_stack_fffffffffffff5ec,in_stack_fffffffffffff5e8));
  bVar1 = std::optional::operator_cast_to_bool
                    ((optional<uint256> *)
                     CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff618,(char *)in_stack_fffffffffffff610,in_stack_fffffffffffff608
              );
    Untranslated(in_stack_fffffffffffff600);
    util::Result<CBlockIndex_*>::Result
              ((Result<CBlockIndex_*> *)in_stack_fffffffffffff5d8,(Error *)in_stack_fffffffffffff5d0
              );
    util::Error::~Error((Error *)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
    std::allocator<char>::~allocator(&local_771);
    goto LAB_007ee302;
  }
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)
             CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffff608,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff600,
             (char *)in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0,in_stack_fffffffffffff5ec,
             SUB41((uint)in_stack_fffffffffffff5e8 >> 0x18,0));
  GetParams((ChainstateManager *)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
  CChainParams::AssumeutxoForBlockhash
            ((CChainParams *)in_stack_fffffffffffff5d8,(uint256 *)in_stack_fffffffffffff5d0);
  bVar1 = std::optional<AssumeutxoData>::has_value
                    ((optional<AssumeutxoData> *)
                     CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    pCVar3 = ::node::BlockManager::LookupBlockIndex
                       ((BlockManager *)
                        CONCAT44(in_stack_fffffffffffff5ec,in_stack_fffffffffffff5e8),
                        (uint256 *)in_stack_fffffffffffff5e0);
    if (pCVar3 == (CBlockIndex *)0x0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff618,(char *)in_stack_fffffffffffff610,
                 in_stack_fffffffffffff608);
      Untranslated(in_stack_fffffffffffff600);
      base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_fffffffffffff5d0);
      tinyformat::format<std::__cxx11::string>
                ((bilingual_str *)CONCAT17(in_stack_fffffffffffff62f,in_stack_fffffffffffff628),
                 &in_stack_fffffffffffff620->original);
      util::Result<CBlockIndex_*>::Result
                ((Result<CBlockIndex_*> *)in_stack_fffffffffffff5d8,
                 (Error *)in_stack_fffffffffffff5d0);
      util::Error::~Error((Error *)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
      bilingual_str::~bilingual_str
                ((bilingual_str *)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
      std::allocator<char>::~allocator(&local_792);
      bVar1 = true;
    }
    else if ((pCVar3->nStatus & 0x60) == 0) {
      if ((*(long *)(in_RSI + 0xce8) == 0) ||
         (pCVar4 = CBlockIndex::GetAncestor
                             ((CBlockIndex *)in_stack_fffffffffffff5d8,
                              (int)((ulong)in_stack_fffffffffffff5d0 >> 0x20)), pCVar4 != pCVar3)) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffff618,(char *)in_stack_fffffffffffff610,
                   in_stack_fffffffffffff608);
        Untranslated(in_stack_fffffffffffff600);
        util::Result<CBlockIndex_*>::Result
                  ((Result<CBlockIndex_*> *)in_stack_fffffffffffff5d8,
                   (Error *)in_stack_fffffffffffff5d0);
        util::Error::~Error((Error *)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
        std::__cxx11::string::~string
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
        std::allocator<char>::~allocator(&local_794);
        bVar1 = true;
      }
      else {
        pCVar5 = Chainstate::GetMempool
                           ((Chainstate *)
                            CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
        if ((pCVar5 == (CTxMemPool *)0x0) ||
           (uVar6 = CTxMemPool::size((CTxMemPool *)in_stack_fffffffffffff5d8), uVar6 == 0)) {
          bVar1 = false;
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffff618,(char *)in_stack_fffffffffffff610,
                     in_stack_fffffffffffff608);
          Untranslated(in_stack_fffffffffffff600);
          util::Result<CBlockIndex_*>::Result
                    ((Result<CBlockIndex_*> *)in_stack_fffffffffffff5d8,
                     (Error *)in_stack_fffffffffffff5d0);
          util::Error::~Error((Error *)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8)
                             );
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
          std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff86b);
          bVar1 = true;
        }
      }
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff618,(char *)in_stack_fffffffffffff610,
                 in_stack_fffffffffffff608);
      Untranslated(in_stack_fffffffffffff600);
      base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_fffffffffffff5d0);
      tinyformat::format<std::__cxx11::string>
                ((bilingual_str *)CONCAT17(in_stack_fffffffffffff62f,in_stack_fffffffffffff628),
                 &in_stack_fffffffffffff620->original);
      util::Result<CBlockIndex_*>::Result
                ((Result<CBlockIndex_*> *)in_stack_fffffffffffff5d8,
                 (Error *)in_stack_fffffffffffff5d0);
      util::Error::~Error((Error *)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
      bilingual_str::~bilingual_str
                ((bilingual_str *)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
      std::allocator<char>::~allocator(&local_793);
      bVar1 = true;
    }
  }
  else {
    GetParams((ChainstateManager *)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
    CChainParams::GetAvailableSnapshotHeights(in_stack_fffffffffffff610);
    util::
    Join<std::vector<int,std::allocator<int>>,char[3],ChainstateManager::ActivateSnapshot(AutoFile&,node::SnapshotMetadata_const&,bool)::__0>
              (local_128,local_790,", ");
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff618,(char *)in_stack_fffffffffffff610,in_stack_fffffffffffff608
              );
    Untranslated(in_stack_fffffffffffff600);
    base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_fffffffffffff5d0);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              ((bilingual_str *)in_stack_fffffffffffff648,in_stack_fffffffffffff640,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff63c,in_stack_fffffffffffff638));
    util::Result<CBlockIndex_*>::Result
              ((Result<CBlockIndex_*> *)in_stack_fffffffffffff5d8,(Error *)in_stack_fffffffffffff5d0
              );
    util::Error::~Error((Error *)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
    bilingual_str::~bilingual_str
              ((bilingual_str *)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
    std::allocator<char>::~allocator(&local_791);
    bVar1 = true;
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
    std::vector<int,_std::allocator<int>_>::~vector
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff5d8);
  }
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
  if (bVar1) goto LAB_007ee302;
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)
             CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffff608,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff600,
             (char *)in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0,in_stack_fffffffffffff5ec,
             SUB41((uint)in_stack_fffffffffffff5e8 >> 0x18,0));
  pCVar7 = ActiveChainstate(in_stack_fffffffffffff5d8);
  sVar11 = pCVar7->m_coinsdb_cache_size_bytes;
  ActiveChainstate(in_stack_fffffffffffff5d8);
  ActiveChainstate(in_stack_fffffffffffff5d8);
  Chainstate::ResizeCoinsCaches
            (in_stack_fffffffffffff648,(size_t)in_stack_fffffffffffff640,
             CONCAT44(in_stack_fffffffffffff63c,in_stack_fffffffffffff638));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)
             CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
  ActivateSnapshot::anon_class_16_2_c907b028::operator()(in_stack_fffffffffffff5f8);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)
             CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffff608,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff600,
             (char *)in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0,in_stack_fffffffffffff5ec,
             SUB41((uint)in_stack_fffffffffffff5e8 >> 0x18,0));
  pCVar8 = std::unique_ptr<Chainstate,_std::default_delete<Chainstate>_>::operator->
                     ((unique_ptr<Chainstate,_std::default_delete<Chainstate>_> *)
                      CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
  dVar12 = (double)(long)sVar11 * 0.99;
  uVar9 = (ulong)dVar12;
  uVar9 = uVar9 | (long)(dVar12 - 9.223372036854776e+18) & (long)uVar9 >> 0x3f;
  bVar14 = in_R8B & 1;
  fs::path::path((path *)0x7ed6c6,
                 (char *)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
  Chainstate::InitCoinsDB
            ((Chainstate *)in_stack_fffffffffffff610,(size_t)in_stack_fffffffffffff608,
             SUB81((ulong)in_stack_fffffffffffff600 >> 0x38,0),
             SUB81((ulong)in_stack_fffffffffffff600 >> 0x30,0),(path *)in_stack_fffffffffffff5f8);
  fs::path::~path((path *)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
  std::unique_ptr<Chainstate,_std::default_delete<Chainstate>_>::operator->
            ((unique_ptr<Chainstate,_std::default_delete<Chainstate>_> *)
             CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
  Chainstate::InitCoinsCache
            ((Chainstate *)in_stack_fffffffffffff5d8,(size_t)in_stack_fffffffffffff5d0);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
  this_00 = std::unique_ptr<Chainstate,_std::default_delete<Chainstate>_>::operator*
                      (&in_stack_fffffffffffff5d8->m_ibd_chainstate);
  PopulateAndValidateSnapshot
            ((ChainstateManager *)
             CONCAT44(in_stack_fffffffffffff83c,
                      CONCAT13(in_stack_fffffffffffff83b,
                               CONCAT12(in_stack_fffffffffffff83a,in_stack_fffffffffffff838))),
             in_stack_fffffffffffff830,in_stack_fffffffffffff828,in_stack_fffffffffffff820);
  bVar1 = util::Result::operator_cast_to_bool
                    ((Result<void> *)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
  if (!bVar1) {
    in_stack_fffffffffffff678.fmt =
         (char *)MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
                           ((AnnotatedMixin<std::recursive_mutex> *)
                            CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffff608,
               (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff600,
               (char *)in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0,in_stack_fffffffffffff5ec
               ,SUB41((uint)in_stack_fffffffffffff5e8 >> 0x18,0));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffff618,(char *)in_stack_fffffffffffff610,in_stack_fffffffffffff608
              );
    Untranslated(in_stack_fffffffffffff600);
    util::ErrorString<void>((Result<void> *)in_stack_fffffffffffff600);
    tinyformat::format<bilingual_str>
              ((bilingual_str *)CONCAT17(in_stack_fffffffffffff62f,in_stack_fffffffffffff628),
               in_stack_fffffffffffff620);
    ActivateSnapshot::anon_class_16_2_a94f38f8::operator()
              ((anon_class_16_2_a94f38f8 *)
               CONCAT17(in_stack_fffffffffffff62f,in_stack_fffffffffffff628),
               in_stack_fffffffffffff620);
    util::Result<CBlockIndex_*>::Result
              ((Result<CBlockIndex_*> *)in_stack_fffffffffffff5d8,(Error *)in_stack_fffffffffffff5d0
              );
    util::Error::~Error((Error *)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
    bilingual_str::~bilingual_str
              ((bilingual_str *)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
    bilingual_str::~bilingual_str
              ((bilingual_str *)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
    bilingual_str::~bilingual_str
              ((bilingual_str *)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff83f);
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
               CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
  }
  util::Result<void>::~Result
            ((Result<void> *)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
  if (bVar1) {
    MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
              ((AnnotatedMixin<std::recursive_mutex> *)
               CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffff608,
               (AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffff600,
               (char *)in_stack_fffffffffffff5f8,in_stack_fffffffffffff5f0,in_stack_fffffffffffff5ec
               ,SUB41((uint)in_stack_fffffffffffff5e8 >> 0x18,0));
    line = (int)((ulong)in_stack_fffffffffffff5f8 >> 0x20);
    ActiveTip((ChainstateManager *)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
    std::unique_ptr<Chainstate,_std::default_delete<Chainstate>_>::operator->
              ((unique_ptr<Chainstate,_std::default_delete<Chainstate>_> *)
               CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
    CChain::Tip((CChain *)in_stack_fffffffffffff5d8);
    bVar1 = ::node::CBlockIndexWorkComparator::operator()
                      ((CBlockIndexWorkComparator *)in_stack_fffffffffffff5e0,
                       (CBlockIndex *)in_stack_fffffffffffff5d8,in_stack_fffffffffffff5d0);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      if ((in_R8B & 1) == 0) {
        snapshot_chainstate_00 =
             std::unique_ptr<Chainstate,_std::default_delete<Chainstate>_>::operator*
                       (&in_stack_fffffffffffff5d8->m_ibd_chainstate);
        bVar1 = ::node::WriteSnapshotBaseBlockhash(snapshot_chainstate_00);
        in_stack_fffffffffffff63c = CONCAT13(bVar1,(int3)in_stack_fffffffffffff63c);
        if (!bVar1) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffff618,(char *)in_stack_fffffffffffff610,
                     in_stack_fffffffffffff608);
          Untranslated(in_stack_fffffffffffff600);
          ActivateSnapshot::anon_class_16_2_a94f38f8::operator()
                    ((anon_class_16_2_a94f38f8 *)
                     CONCAT17(in_stack_fffffffffffff62f,in_stack_fffffffffffff628),
                     in_stack_fffffffffffff620);
          util::Result<CBlockIndex_*>::Result
                    ((Result<CBlockIndex_*> *)in_stack_fffffffffffff5d8,
                     (Error *)in_stack_fffffffffffff5d0);
          util::Error::~Error((Error *)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8)
                             );
          bilingual_str::~bilingual_str
                    ((bilingual_str *)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8))
          ;
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
          std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff83c);
          goto LAB_007ee2c6;
        }
      }
      bVar1 = std::unique_ptr::operator_cast_to_bool
                        ((unique_ptr<Chainstate,_std::default_delete<Chainstate>_> *)
                         CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        __assert_fail("!m_snapshot_chainstate",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                      ,0x1696,
                      "util::Result<CBlockIndex *> ChainstateManager::ActivateSnapshot(AutoFile &, const SnapshotMetadata &, bool)"
                     );
      }
      std::unique_ptr<Chainstate,_std::default_delete<Chainstate>_>::swap
                ((unique_ptr<Chainstate,_std::default_delete<Chainstate>_> *)
                 CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8),
                 (unique_ptr<Chainstate,_std::default_delete<Chainstate>_> *)0x7edf6a);
      std::unique_ptr<Chainstate,_std::default_delete<Chainstate>_>::operator->
                ((unique_ptr<Chainstate,_std::default_delete<Chainstate>_> *)
                 CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
      uVar2 = Chainstate::LoadChainTip(this_00);
      if (!(bool)uVar2) {
        __assert_fail("chaintip_loaded",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                      ,0x1699,
                      "util::Result<CBlockIndex *> ChainstateManager::ActivateSnapshot(AutoFile &, const SnapshotMetadata &, bool)"
                     );
      }
      CTxMemPool::size((CTxMemPool *)in_stack_fffffffffffff5d8);
      inline_assertion_check<true,bool>
                ((bool *)in_stack_fffffffffffff608,(char *)in_stack_fffffffffffff600,line,
                 in_stack_fffffffffffff5f0,
                 (char *)CONCAT44(in_stack_fffffffffffff5ec,in_stack_fffffffffffff5e8));
      std::unique_ptr<Chainstate,_std::default_delete<Chainstate>_>::operator->
                ((unique_ptr<Chainstate,_std::default_delete<Chainstate>_> *)
                 CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
      inline_assertion_check<true,bool>
                ((bool *)in_stack_fffffffffffff608,(char *)in_stack_fffffffffffff600,line,
                 in_stack_fffffffffffff5f0,
                 (char *)CONCAT44(in_stack_fffffffffffff5ec,in_stack_fffffffffffff5e8));
      pCVar5 = *(CTxMemPool **)(*(long *)(in_RSI + 0x10) + 0x28);
      this_01 = (ChainstateManager *)(in_RSI + 8);
      pCVar10 = std::unique_ptr<Chainstate,_std::default_delete<Chainstate>_>::operator->
                          ((unique_ptr<Chainstate,_std::default_delete<Chainstate>_> *)
                           CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
      pCVar10->m_mempool = pCVar5;
      *(undefined8 *)(*(long *)(in_RSI + 0x10) + 0x28) = 0;
      pCVar10 = std::unique_ptr<Chainstate,_std::default_delete<Chainstate>_>::get
                          ((unique_ptr<Chainstate,_std::default_delete<Chainstate>_> *)
                           CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
      *(pointer *)(in_RSI + 0x10) = pCVar10;
      local_770 = (_Optional_payload_base<int>)GetSnapshotBaseHeight(in_stack_fffffffffffff5e0);
      ((_Optional_base<int,_true,_true> *)(in_RSI + 0xa10))->_M_payload =
           (_Optional_payload<int,_true,_true,_true>)local_770;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffff5ec,in_stack_fffffffffffff5e8),
                 (char *)in_stack_fffffffffffff5e0);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffff5ec,in_stack_fffffffffffff5e8),
                 (char *)in_stack_fffffffffffff5e0);
      base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_fffffffffffff5d0);
      this_02 = local_718;
      uVar13 = 2;
      logging_function._M_str._0_7_ = in_stack_fffffffffffff698;
      logging_function._M_len = uVar9;
      logging_function._M_str._7_1_ = bVar14;
      source_file._M_str = (char *)pCVar8;
      source_file._M_len = (size_t)this_00;
      LogPrintFormatInternal<std::__cxx11::string>
                (logging_function,source_file,in_stack_fffffffffffff63c,in_stack_fffffffffffff630,
                 in_stack_fffffffffffff770,in_stack_fffffffffffff678,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(uVar2,in_stack_fffffffffffff780));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff5cc,uVar13));
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffff5ec,in_stack_fffffffffffff5e8),
                 (char *)in_stack_fffffffffffff5e0);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT44(in_stack_fffffffffffff5ec,in_stack_fffffffffffff5e8),
                 (char *)in_stack_fffffffffffff5e0);
      this_03 = "[snapshot] (%.2f MB)\n";
      std::unique_ptr<Chainstate,_std::default_delete<Chainstate>_>::operator->
                ((unique_ptr<Chainstate,_std::default_delete<Chainstate>_> *)
                 CONCAT44(in_stack_fffffffffffff5cc,uVar13));
      Chainstate::CoinsTip
                ((Chainstate *)CONCAT44(in_stack_fffffffffffff5ec,in_stack_fffffffffffff5e8));
      sVar11 = CCoinsViewCache::DynamicMemoryUsage(this_02);
      local_810._0_8_ = sVar11 / 1000000;
      in_stack_fffffffffffff5d8 = (ChainstateManager *)local_810;
      in_stack_fffffffffffff5c8 = 2;
      logging_function_00._M_str._0_7_ = in_stack_fffffffffffff698;
      logging_function_00._M_len = uVar9;
      logging_function_00._M_str._7_1_ = bVar14;
      source_file_00._M_str = (char *)pCVar8;
      source_file_00._M_len = (size_t)this_00;
      LogPrintFormatInternal<unsigned_long>
                (logging_function_00,source_file_00,in_stack_fffffffffffff63c,
                 in_stack_fffffffffffff630,(Level)this_03,in_stack_fffffffffffff678,
                 (unsigned_long *)CONCAT17(uVar2,in_stack_fffffffffffff780));
      MaybeRebalanceCaches(this_01);
      util::Result<CBlockIndex_*>::Result
                ((Result<CBlockIndex_*> *)this_03,(T)in_stack_fffffffffffff5d8);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffff618,(char *)in_stack_fffffffffffff610,
                 in_stack_fffffffffffff608);
      Untranslated(in_stack_fffffffffffff600);
      ActivateSnapshot::anon_class_16_2_a94f38f8::operator()
                ((anon_class_16_2_a94f38f8 *)
                 CONCAT17(in_stack_fffffffffffff62f,in_stack_fffffffffffff628),
                 in_stack_fffffffffffff620);
      util::Result<CBlockIndex_*>::Result
                ((Result<CBlockIndex_*> *)in_stack_fffffffffffff5d8,
                 (Error *)in_stack_fffffffffffff5d0);
      util::Error::~Error((Error *)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
      bilingual_str::~bilingual_str
                ((bilingual_str *)CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
      std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffff83d);
    }
LAB_007ee2c6:
    UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
              ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
               CONCAT44(in_stack_fffffffffffff5cc,in_stack_fffffffffffff5c8));
  }
  std::unique_ptr<Chainstate,_std::default_delete<Chainstate>_>::~unique_ptr
            (&in_stack_fffffffffffff5d8->m_ibd_chainstate);
LAB_007ee302:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

util::Result<CBlockIndex*> ChainstateManager::ActivateSnapshot(
        AutoFile& coins_file,
        const SnapshotMetadata& metadata,
        bool in_memory)
{
    uint256 base_blockhash = metadata.m_base_blockhash;

    if (this->SnapshotBlockhash()) {
        return util::Error{Untranslated("Can't activate a snapshot-based chainstate more than once")};
    }

    CBlockIndex* snapshot_start_block{};

    {
        LOCK(::cs_main);

        if (!GetParams().AssumeutxoForBlockhash(base_blockhash).has_value()) {
            auto available_heights = GetParams().GetAvailableSnapshotHeights();
            std::string heights_formatted = util::Join(available_heights, ", ", [&](const auto& i) { return util::ToString(i); });
            return util::Error{strprintf(Untranslated("assumeutxo block hash in snapshot metadata not recognized (hash: %s). The following snapshot heights are available: %s"),
                base_blockhash.ToString(),
                heights_formatted)};
        }

        snapshot_start_block = m_blockman.LookupBlockIndex(base_blockhash);
        if (!snapshot_start_block) {
            return util::Error{strprintf(Untranslated("The base block header (%s) must appear in the headers chain. Make sure all headers are syncing, and call loadtxoutset again"),
                          base_blockhash.ToString())};
        }

        bool start_block_invalid = snapshot_start_block->nStatus & BLOCK_FAILED_MASK;
        if (start_block_invalid) {
            return util::Error{strprintf(Untranslated("The base block header (%s) is part of an invalid chain"), base_blockhash.ToString())};
        }

        if (!m_best_header || m_best_header->GetAncestor(snapshot_start_block->nHeight) != snapshot_start_block) {
            return util::Error{Untranslated("A forked headers-chain with more work than the chain with the snapshot base block header exists. Please proceed to sync without AssumeUtxo.")};
        }

        auto mempool{m_active_chainstate->GetMempool()};
        if (mempool && mempool->size() > 0) {
            return util::Error{Untranslated("Can't activate a snapshot when mempool not empty")};
        }
    }

    int64_t current_coinsdb_cache_size{0};
    int64_t current_coinstip_cache_size{0};

    // Cache percentages to allocate to each chainstate.
    //
    // These particular percentages don't matter so much since they will only be
    // relevant during snapshot activation; caches are rebalanced at the conclusion of
    // this function. We want to give (essentially) all available cache capacity to the
    // snapshot to aid the bulk load later in this function.
    static constexpr double IBD_CACHE_PERC = 0.01;
    static constexpr double SNAPSHOT_CACHE_PERC = 0.99;

    {
        LOCK(::cs_main);
        // Resize the coins caches to ensure we're not exceeding memory limits.
        //
        // Allocate the majority of the cache to the incoming snapshot chainstate, since
        // (optimistically) getting to its tip will be the top priority. We'll need to call
        // `MaybeRebalanceCaches()` once we're done with this function to ensure
        // the right allocation (including the possibility that no snapshot was activated
        // and that we should restore the active chainstate caches to their original size).
        //
        current_coinsdb_cache_size = this->ActiveChainstate().m_coinsdb_cache_size_bytes;
        current_coinstip_cache_size = this->ActiveChainstate().m_coinstip_cache_size_bytes;

        // Temporarily resize the active coins cache to make room for the newly-created
        // snapshot chain.
        this->ActiveChainstate().ResizeCoinsCaches(
            static_cast<size_t>(current_coinstip_cache_size * IBD_CACHE_PERC),
            static_cast<size_t>(current_coinsdb_cache_size * IBD_CACHE_PERC));
    }

    auto snapshot_chainstate = WITH_LOCK(::cs_main,
        return std::make_unique<Chainstate>(
            /*mempool=*/nullptr, m_blockman, *this, base_blockhash));

    {
        LOCK(::cs_main);
        snapshot_chainstate->InitCoinsDB(
            static_cast<size_t>(current_coinsdb_cache_size * SNAPSHOT_CACHE_PERC),
            in_memory, false, "chainstate");
        snapshot_chainstate->InitCoinsCache(
            static_cast<size_t>(current_coinstip_cache_size * SNAPSHOT_CACHE_PERC));
    }

    auto cleanup_bad_snapshot = [&](bilingual_str reason) EXCLUSIVE_LOCKS_REQUIRED(::cs_main) {
        this->MaybeRebalanceCaches();

        // PopulateAndValidateSnapshot can return (in error) before the leveldb datadir
        // has been created, so only attempt removal if we got that far.
        if (auto snapshot_datadir = node::FindSnapshotChainstateDir(m_options.datadir)) {
            // We have to destruct leveldb::DB in order to release the db lock, otherwise
            // DestroyDB() (in DeleteCoinsDBFromDisk()) will fail. See `leveldb::~DBImpl()`.
            // Destructing the chainstate (and so resetting the coinsviews object) does this.
            snapshot_chainstate.reset();
            bool removed = DeleteCoinsDBFromDisk(*snapshot_datadir, /*is_snapshot=*/true);
            if (!removed) {
                GetNotifications().fatalError(strprintf(_("Failed to remove snapshot chainstate dir (%s). "
                    "Manually remove it before restarting.\n"), fs::PathToString(*snapshot_datadir)));
            }
        }
        return util::Error{std::move(reason)};
    }